

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

bool run_msgpack_example(void)

{
  pointer pcVar1;
  int iVar2;
  bool bVar3;
  ostream *poVar4;
  code **ppcVar5;
  char cVar6;
  long lVar7;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>
  __l;
  any var2;
  any var;
  form form;
  stringstream ss;
  any local_288;
  any local_278;
  undefined1 local_260 [48];
  sub_form local_230;
  sub_form local_220;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
  local_210;
  undefined1 *local_1e0 [2];
  undefined1 local_1d0 [16];
  code *local_1c0;
  undefined8 local_1b8;
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  local_278._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  local_278._M_storage._M_ptr = (void *)0x0;
  local_288._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  local_288._M_storage._M_ptr = (void *)0x0;
  local_210.first._M_dataplus._M_p = (pointer)&local_210.first.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"compact","");
  local_210.second._M_manager = std::any::_Manager_internal<bool>::_S_manage;
  local_210.second._M_storage = (_Storage)0x1;
  local_1e0[0] = local_1d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"schema","");
  local_1c0 = std::any::_Manager_internal<int>::_S_manage;
  local_1b8 = 0;
  __l._M_len = 2;
  __l._M_array = &local_210;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
         *)local_260,__l,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &local_230,(allocator_type *)&local_220);
  std::any::operator=(&local_278,
                      (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                       *)local_260);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
               *)local_260);
  lVar7 = -0x60;
  ppcVar5 = &local_1c0;
  do {
    if (*ppcVar5 != (code *)0x0) {
      (**ppcVar5)(3,ppcVar5,0);
      *ppcVar5 = (code *)0x0;
    }
    if (ppcVar5 + -2 != (code **)ppcVar5[-4]) {
      operator_delete(ppcVar5[-4],(ulong)(ppcVar5[-2] + 1));
    }
    ppcVar5 = ppcVar5 + -6;
    lVar7 = lVar7 + 0x30;
  } while (lVar7 != 0);
  goodform::msgpack::serialize(&local_278,local_1a0);
  goodform::msgpack::deserialize((istream *)local_1b0,&local_288);
  goodform::form::form((form *)&local_210,&local_288);
  pcVar1 = local_260 + 0x10;
  local_260._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"compact","");
  local_230 = goodform::sub_form::at((sub_form *)&local_210,(string *)local_260);
  local_220.error_._0_1_ = goodform::sub_form::boolean(&local_230);
  goodform::boolean_validator::val((boolean_validator *)&local_220);
  if ((pointer)local_260._0_8_ != pcVar1) {
    operator_delete((void *)local_260._0_8_,(ulong)(local_260._16_8_ + 1));
  }
  local_260._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"schema","");
  local_220 = goodform::sub_form::at((sub_form *)&local_210,(string *)local_260);
  goodform::sub_form::int32(&local_230);
  iVar2 = (int)local_230.variant_;
  if ((pointer)local_260._0_8_ != pcVar1) {
    operator_delete((void *)local_260._0_8_,(ulong)(local_260._16_8_ + 1));
  }
  bVar3 = goodform::form::is_good((form *)&local_210);
  if (bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"{ \"compact\": ",0xd);
    *(uint *)(std::ostream::write + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::ostream::write + *(long *)(std::cout + -0x18)) | 1;
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,", \"schema\": ",0xc);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,iVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," }",2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    cVar6 = -0x60;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"MsgPack Passed.",0xf);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  }
  else {
    cVar6 = ' ';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"MsgPack Passed.",0xf);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
  }
  std::ostream::put(cVar6);
  std::ostream::flush();
  if ((any *)local_210.first.field_2._M_allocated_capacity != &local_210.second) {
    operator_delete((void *)local_210.first.field_2._M_allocated_capacity,
                    (ulong)(local_210.second._M_manager + 1));
  }
  if (local_288._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_288._M_manager)(_Op_destroy,&local_288,(_Arg *)0x0);
    local_288._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_278._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_278._M_manager)(_Op_destroy,&local_278,(_Arg *)0x0);
    local_278._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  return bVar3;
}

Assistant:

bool run_msgpack_example()
{
  std::stringstream ss;
  goodform::any var, var2;
  var = goodform::object_t
    {
      {"compact", true},
      {"schema", 0}
    };

  goodform::msgpack::serialize(var, ss);
  goodform::msgpack::deserialize(ss, var2);

  goodform::form form(var2);

  struct
  {
    bool compact;
    std::int32_t schema;
  } mpack;

  mpack.compact = form.at("compact").boolean().val();
  mpack.schema = form.at("schema").int32().val();

  if (form.is_good())
  {
    std::cout << "{ \"compact\": " << std::boolalpha << mpack.compact << ", \"schema\": " << mpack.schema << " }" << std::endl;
    std::cout << "MsgPack Passed." << std::endl;
    return true;
  }

  std::cerr << "MsgPack Passed." << std::endl;
  return false;
}